

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreateP2shLockingScript
                   (Script *__return_storage_ptr__,Script *redeem_script)

{
  ByteData160 script_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  HashUtil::Hash160((ByteData160 *)&_Stack_28,redeem_script);
  CreateP2shLockingScript(__return_storage_ptr__,(ByteData160 *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2shLockingScript(const Script& redeem_script) {
  // script hash作成
  ByteData160 script_hash = HashUtil::Hash160(redeem_script);

  return CreateP2shLockingScript(script_hash);
}